

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetalat.cpp
# Opt level: O2

void __thiscall
EnvironmentNAVXYTHETALAT::GetLazyPreds
          (EnvironmentNAVXYTHETALAT *this,int TargetStateID,
          vector<int,_std::allocator<int>_> *PredIDV,vector<int,_std::allocator<int>_> *CostV,
          vector<bool,_std::allocator<bool>_> *isTrueCost)

{
  EnvNAVXYTHETALATHashEntry_t *pEVar1;
  pointer piVar2;
  value_type pEVar3;
  int iVar4;
  vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *pvVar5;
  reference ppEVar6;
  value_type_conflict1 *__x;
  code *pcVar7;
  char cVar8;
  uint uVar9;
  size_type __n;
  long *plVar10;
  uint uVar11;
  uint local_5c;
  vector<int,_std::allocator<int>_> *local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<bool,_std::allocator<bool>_> *local_48;
  vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_> *local_40;
  EnvNAVXYTHETALATHashEntry_t *local_38;
  
  pEVar1 = (this->StateID2CoordTable).
           super__Vector_base<EnvNAVXYTHETALATHashEntry_t_*,_std::allocator<EnvNAVXYTHETALATHashEntry_t_*>_>
           ._M_impl.super__Vector_impl_data._M_start[TargetStateID];
  piVar2 = (PredIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((PredIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (PredIDV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  piVar2 = (CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (CostV->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish
         = piVar2;
  }
  pvVar5 = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.PredActionsV;
  local_58 = PredIDV;
  local_48 = isTrueCost;
  std::vector<int,_std::allocator<int>_>::reserve
            (PredIDV,(long)pvVar5[(uint)(int)pEVar1->Theta].
                           super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)pvVar5[(uint)(int)pEVar1->Theta].
                           super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3);
  pvVar5 = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.PredActionsV;
  local_50 = CostV;
  std::vector<int,_std::allocator<int>_>::reserve
            (CostV,(long)pvVar5[(uint)(int)pEVar1->Theta].
                         super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)pvVar5[(uint)(int)pEVar1->Theta].
                         super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3);
  pvVar5 = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.PredActionsV;
  cVar8 = pEVar1->Theta;
  local_40 = pvVar5 + (uint)(int)cVar8;
  local_38 = pEVar1;
  for (__n = 0; pEVar1 = local_38,
      (long)__n <
      (long)(int)((ulong)((long)pvVar5[(uint)(int)cVar8].
                                super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)pvVar5[(uint)(int)cVar8].
                               super__Vector_base<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3); __n = __n + 1) {
    ppEVar6 = std::vector<EnvNAVXYTHETALATAction_t_*,_std::allocator<EnvNAVXYTHETALATAction_t_*>_>::
              at(local_40,__n);
    pEVar3 = *ppEVar6;
    uVar9 = pEVar1->X - (int)pEVar3->dX;
    uVar11 = pEVar1->Y - (int)pEVar3->dY;
    cVar8 = pEVar3->starttheta;
    iVar4 = (*(this->super_EnvironmentNAVXYTHETALATTICE).super_DiscreteSpaceInformation.
              _vptr_DiscreteSpaceInformation[0x41])(this,(ulong)uVar9,(ulong)uVar11);
    if ((char)iVar4 != '\0') {
      pcVar7 = (code *)this->GetHashEntry;
      plVar10 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                        *(long *)&this->field_0x1c8);
      if (((ulong)pcVar7 & 1) != 0) {
        pcVar7 = *(code **)(pcVar7 + *plVar10 + -1);
      }
      __x = (value_type_conflict1 *)(*pcVar7)(plVar10,uVar9,uVar11,(int)cVar8);
      if (__x == (value_type_conflict1 *)0x0) {
        pcVar7 = (code *)this->CreateNewHashEntry;
        plVar10 = (long *)((long)&(this->super_EnvironmentNAVXYTHETALATTICE).
                                  super_DiscreteSpaceInformation._vptr_DiscreteSpaceInformation +
                          *(long *)&this->field_0x1d8);
        if (((ulong)pcVar7 & 1) != 0) {
          pcVar7 = *(code **)(pcVar7 + *plVar10 + -1);
        }
        __x = (value_type_conflict1 *)(*pcVar7)(plVar10,uVar9,uVar11,(int)cVar8);
      }
      std::vector<int,_std::allocator<int>_>::push_back(local_58,__x);
      local_5c = pEVar3->cost;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(local_50,(int *)&local_5c);
      std::vector<bool,_std::allocator<bool>_>::push_back(local_48,false);
    }
    pvVar5 = (this->super_EnvironmentNAVXYTHETALATTICE).EnvNAVXYTHETALATCfg.PredActionsV;
    cVar8 = local_38->Theta;
  }
  return;
}

Assistant:

void EnvironmentNAVXYTHETALAT::GetLazyPreds(
    int TargetStateID,
    std::vector<int>* PredIDV,
    std::vector<int>* CostV,
    std::vector<bool>* isTrueCost)
{
    int aind;

#if TIME_DEBUG
    clock_t currenttime = clock();
#endif

    // get X, Y for the state
    EnvNAVXYTHETALATHashEntry_t* HashEntry = StateID2CoordTable[TargetStateID];

    // clear the successor array
    PredIDV->clear();
    CostV->clear();
    PredIDV->reserve(EnvNAVXYTHETALATCfg.PredActionsV[(unsigned int)HashEntry->Theta].size());
    CostV->reserve(EnvNAVXYTHETALATCfg.PredActionsV[(unsigned int)HashEntry->Theta].size());

    // iterate through actions
    std::vector<EnvNAVXYTHETALATAction_t*>* actionsV = &EnvNAVXYTHETALATCfg.PredActionsV[(unsigned int)HashEntry->Theta];
    for (aind = 0; aind < (int)EnvNAVXYTHETALATCfg.PredActionsV[(unsigned int)HashEntry->Theta].size(); aind++)
    {
        EnvNAVXYTHETALATAction_t* nav3daction = actionsV->at(aind);

        int predX = HashEntry->X - nav3daction->dX;
        int predY = HashEntry->Y - nav3daction->dY;
        int predTheta = nav3daction->starttheta;

        //skip the invalid cells
        if (!IsValidCell(predX, predY)) {
            continue;
        }

        EnvNAVXYTHETALATHashEntry_t* OutHashEntry;
        if ((OutHashEntry = (this->*GetHashEntry)(predX, predY, predTheta)) == NULL) {
            OutHashEntry = (this->*CreateNewHashEntry)(predX, predY, predTheta);
        }

        PredIDV->push_back(OutHashEntry->stateID);
        CostV->push_back(nav3daction->cost);
        isTrueCost->push_back(false);
    }

#if TIME_DEBUG
    time_getsuccs += clock()-currenttime;
#endif
}